

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O3

void __thiscall
TasGrid::GridGlobal::evaluateBatchGPUtempl<double>
          (GridGlobal *this,double *gpu_x,int cpu_num_x,double *gpu_y)

{
  int iVar1;
  GpuVector<double> gpu_basis;
  GpuVector<double> local_48;
  double *local_38;
  
  local_38 = gpu_y;
  loadGpuValues<double>(this);
  iVar1 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  local_48.num_entries = 0;
  local_48.gpu_data = (double *)0x0;
  GpuVector<double>::resize
            (&local_48,(this->super_BaseCanonicalGrid).acceleration,(long)iVar1 * (long)cpu_num_x);
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x16])
            (this,gpu_x,(ulong)(uint)cpu_num_x,local_48.gpu_data);
  TasGpu::denseMultiply<double>
            ((this->super_BaseCanonicalGrid).acceleration,
             (this->super_BaseCanonicalGrid).num_outputs,cpu_num_x,iVar1,1.0,
             &((this->gpu_cache)._M_t.
               super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
               .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl)->
              values,&local_48,0.0,local_38);
  GpuVector<double>::clear(&local_48);
  return;
}

Assistant:

void GridGlobal::evaluateBatchGPUtempl(T const gpu_x[], int cpu_num_x, T gpu_y[]) const{
    loadGpuValues<T>();
    int num_points = points.getNumIndexes();

    GpuVector<T> gpu_basis(acceleration, cpu_num_x, num_points);
    evaluateHierarchicalFunctionsGPU(gpu_x, cpu_num_x, gpu_basis.data());
    TasGpu::denseMultiply(acceleration, num_outputs, cpu_num_x, num_points, 1.0, getGpuCache<T>()->values, gpu_basis, 0.0, gpu_y);
}